

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_floats(void)

{
  int iVar1;
  uint32_t uVar2;
  ptrdiff_t pVar3;
  char *pcVar4;
  float fVar5;
  char *d;
  ptrdiff_t sz;
  char *local_78;
  char *d4_2;
  char *d3_2;
  char *d2_2;
  char *d1_2;
  char *local_50;
  char *d4_1;
  char *d3_1;
  char *d2_1;
  char *d1_1;
  char *local_28;
  char *d4;
  char *d3;
  char *d2;
  char *d1;
  
  _plan(0x24,true);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","test_floats");
  d2 = mp_encode_float(data,1.0);
  d3 = data;
  d4 = data;
  local_28 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"float (float) 1.0");
  d1_1._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_float(data,d2);
  _ok((uint)(pVar3 == 0),"mp_check_float(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x139,
      "mp_check_float((float) 1.0) == 0");
  fVar5 = mp_decode_float(&d3);
  _ok((uint)(fVar5 == 1.0),"mp_decode_float(&d2 COMPLEX(COMMA &ext_type)) == ((float) 1.0)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x139,
      "mp_decode(mp_encode((float) 1.0)) == (float) 1.0");
  mp_next(&d4);
  iVar1 = mp_check(&local_28,d4 + 5);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x139,
      "mp_check((float) 1.0)");
  _ok((uint)((long)d2 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x139,
      "len(mp_encode_float((float) 1.0)");
  _ok((uint)(d2 == d3),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x139,
      "len(mp_decode_float((float) 1.0))");
  _ok((uint)(d2 == d4),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x139,
      "len(mp_next_float((float) 1.0))");
  _ok((uint)(d2 == local_28),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x139,
      "len(mp_check_float((float) 1.0))");
  uVar2 = mp_sizeof_float(1.0);
  _ok((uint)(uVar2 == 5),"mp_sizeof_float((float) 1.0) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x139,
      "mp_sizeof_float((float) 1.0)");
  iVar1 = memcmp(data,anon_var_dwarf_2be7,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xca\\x3f\\x80\\x00\\x00\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x139,
      "mp_encode((float) 1.0) == \"\\xca\\x3f\\x80\\x00\\x00\"");
  d2_1 = mp_encode_float(data,3.141593);
  d3_1 = data;
  d4_1 = data;
  local_50 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"float (float) 3.141593");
  d1_2._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_float(data,d2_1);
  _ok((uint)(pVar3 == 0),"mp_check_float(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13a,
      "mp_check_float((float) 3.141593) == 0");
  fVar5 = mp_decode_float(&d3_1);
  _ok((uint)(fVar5 == 3.141593),
      "mp_decode_float(&d2 COMPLEX(COMMA &ext_type)) == ((float) 3.141593)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13a,
      "mp_decode(mp_encode((float) 3.141593)) == (float) 3.141593");
  mp_next(&d4_1);
  iVar1 = mp_check(&local_50,d4_1 + 5);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13a,
      "mp_check((float) 3.141593)");
  _ok((uint)((long)d2_1 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13a,
      "len(mp_encode_float((float) 3.141593)");
  _ok((uint)(d2_1 == d3_1),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13a,
      "len(mp_decode_float((float) 3.141593))");
  _ok((uint)(d2_1 == d4_1),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13a,
      "len(mp_next_float((float) 3.141593))");
  _ok((uint)(d2_1 == local_50),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13a,
      "len(mp_check_float((float) 3.141593))");
  uVar2 = mp_sizeof_float(3.141593);
  _ok((uint)(uVar2 == 5),"mp_sizeof_float((float) 3.141593) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13a,
      "mp_sizeof_float((float) 3.141593)");
  iVar1 = memcmp(data,anon_var_dwarf_2c8f,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xca\\x40\\x49\\x0f\\xdc\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13a,
      "mp_encode((float) 3.141593) == \"\\xca\\x40\\x49\\x0f\\xdc\"");
  d2_2 = mp_encode_float(data,-1e+38);
  d3_2 = data;
  d4_2 = data;
  local_78 = data;
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"float (float) -1e38f");
  sz._4_4_ = fprintf(_stdout,"\n");
  pVar3 = mp_check_float(data,d2_2);
  _ok((uint)(pVar3 == 0),"mp_check_float(data, d1) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13b,
      "mp_check_float((float) -1e38f) == 0");
  fVar5 = mp_decode_float(&d3_2);
  _ok((uint)(fVar5 == -1e+38),"mp_decode_float(&d2 COMPLEX(COMMA &ext_type)) == ((float) -1e38f)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13b,
      "mp_decode(mp_encode((float) -1e38f)) == (float) -1e38f");
  mp_next(&d4_2);
  iVar1 = mp_check(&local_78,d4_2 + 5);
  _ok((uint)((iVar1 != 0 ^ 0xffU) & 1),"!mp_check(&d4, d3 + 5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13b,
      "mp_check((float) -1e38f)");
  _ok((uint)((long)d2_2 - (long)data == 5),"(d1 - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13b,
      "len(mp_encode_float((float) -1e38f)");
  _ok((uint)(d2_2 == d3_2),"d1 == d2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13b,
      "len(mp_decode_float((float) -1e38f))");
  _ok((uint)(d2_2 == d4_2),"d1 == d3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13b,
      "len(mp_next_float((float) -1e38f))");
  _ok((uint)(d2_2 == local_78),"d1 == d4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13b,
      "len(mp_check_float((float) -1e38f))");
  uVar2 = mp_sizeof_float(-1e+38);
  _ok((uint)(uVar2 == 5),"mp_sizeof_float((float) -1e38f) == 5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13b,
      "mp_sizeof_float((float) -1e38f)");
  iVar1 = memcmp(data,anon_var_dwarf_2d37,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xca\\xfe\\x96\\x76\\x99\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13b,
      "mp_encode((float) -1e38f) == \"\\xca\\xfe\\x96\\x76\\x99\"");
  _space((FILE *)_stdout);
  fprintf(_stdout,"# ");
  fprintf(_stdout,"float_safe");
  sz._0_4_ = fprintf(_stdout,"\n");
  d = (char *)0x0;
  pcVar4 = mp_encode_float_safe((char *)0x0,(ptrdiff_t *)&d,3.141593);
  _ok((uint)(d == (char *)0xfffffffffffffffb),"-sz == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13d,
      "size after mp_encode_float_safe(NULL, &sz)");
  _ok((uint)(pcVar4 == (char *)0x0),"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13d,
      "mp_encode_float_safe(NULL, &sz)");
  d = (char *)0x5;
  pcVar4 = mp_encode_float_safe(data,(ptrdiff_t *)&d,3.141593);
  _ok((uint)(d == (char *)0x0),"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13d,
      "size after mp_encode_float_safe(buf, &sz)");
  _ok((uint)((long)pcVar4 - (long)data == 5),"(d - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13d,
      "len of mp_encode_float_safe(buf, &sz)");
  iVar1 = memcmp(data,anon_var_dwarf_2c8f,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xca\\x40\\x49\\x0f\\xdc\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13d,
      "mp_encode_float_safe(buf, &sz)");
  d = (char *)0x4;
  pcVar4 = mp_encode_float_safe(data,(ptrdiff_t *)&d,3.141593);
  _ok((uint)(d == (char *)0xffffffffffffffff),"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13d,
      "size after mp_encode_float_safe(buf, &sz) overflow");
  _ok((uint)(pcVar4 == data),"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13d,
      "mp_encode_float_safe(buf, &sz) overflow");
  pcVar4 = mp_encode_float_safe(data,(ptrdiff_t *)0x0,3.141593);
  _ok((uint)((long)pcVar4 - (long)data == 5),"(d - data) == (5)",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13d,
      "len of mp_encode_float_safe(buf, NULL)");
  iVar1 = memcmp(data,anon_var_dwarf_2c8f,5);
  _ok((uint)(iVar1 == 0),"memcmp(data, (\"\\xca\\x40\\x49\\x0f\\xdc\"), (5)) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x13d,
      "mp_encode_float_safe(buf, NULL)");
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","test_floats");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_floats(void)
{
	plan(3*9 + 9);
	header();

	test_float((float) 1.0, "\xca\x3f\x80\x00\x00", 5);
	test_float((float) 3.141593, "\xca\x40\x49\x0f\xdc", 5);
	test_float((float) -1e38f, "\xca\xfe\x96\x76\x99", 5);

	test_float_safe((float) 3.141593, "\xca\x40\x49\x0f\xdc", 5);

	footer();
	return check_plan();
}